

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__create_png_alpha_expand8(stbi_uc *dest,stbi_uc *src,stbi__uint32 x,int img_n)

{
  int local_24;
  int i;
  int img_n_local;
  stbi__uint32 x_local;
  stbi_uc *src_local;
  stbi_uc *dest_local;
  
  if (img_n == 1) {
    for (local_24 = x - 1; -1 < local_24; local_24 = local_24 + -1) {
      dest[local_24 * 2 + 1] = 0xff;
      dest[local_24 << 1] = src[local_24];
    }
  }
  else {
    if (img_n != 3) {
      __assert_fail("img_n == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/mehedirm6244[P]sysfex/./lib/stb_image.h"
                    ,0x124c,
                    "void stbi__create_png_alpha_expand8(stbi_uc *, stbi_uc *, stbi__uint32, int)");
    }
    for (local_24 = x - 1; -1 < local_24; local_24 = local_24 + -1) {
      dest[local_24 * 4 + 3] = 0xff;
      dest[local_24 * 4 + 2] = src[local_24 * 3 + 2];
      dest[local_24 * 4 + 1] = src[local_24 * 3 + 1];
      dest[local_24 << 2] = src[local_24 * 3];
    }
  }
  return;
}

Assistant:

static void stbi__create_png_alpha_expand8(stbi_uc *dest, stbi_uc *src, stbi__uint32 x, int img_n)
{
   int i;
   // must process data backwards since we allow dest==src
   if (img_n == 1) {
      for (i=x-1; i >= 0; --i) {
         dest[i*2+1] = 255;
         dest[i*2+0] = src[i];
      }
   } else {
      STBI_ASSERT(img_n == 3);
      for (i=x-1; i >= 0; --i) {
         dest[i*4+3] = 255;
         dest[i*4+2] = src[i*3+2];
         dest[i*4+1] = src[i*3+1];
         dest[i*4+0] = src[i*3+0];
      }
   }
}